

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

transformData *
deleteTransformation(transformData *xform,abrAtomListProc *delAtomProc,void *deletestuff)

{
  xformAtomRecords_t *pxVar1;
  biasFunction_t *pbVar2;
  biasFunction *nextf;
  biasFunction *f;
  xformAtomRecords *next;
  xformAtomRecords *p;
  transformData *following;
  void *deletestuff_local;
  abrAtomListProc *delAtomProc_local;
  transformData *xform_local;
  
  p = (xformAtomRecords *)0x0;
  if (xform != (transformData *)0x0) {
    next = xform->recs;
    while (next != (xformAtomRecords *)0x0) {
      pxVar1 = next->next;
      deleteXformAtomRecord(next,delAtomProc,deletestuff);
      next = pxVar1;
    }
    xform->lastrec = (xformAtomRecords *)0x0;
    xform->recs = (xformAtomRecords *)0x0;
    if (xform->name != (char *)0x0) {
      free(xform->name);
      xform->name = (char *)0x0;
    }
    nextf = xform->funcs;
    while (nextf != (biasFunction *)0x0) {
      pbVar2 = nextf->next;
      nextf->next = (biasFunction_t *)0x0;
      free(nextf);
      nextf = pbVar2;
    }
    xform->funcs = (biasFunction *)0x0;
    p = (xformAtomRecords *)xform->next;
    xform->next = (transformdata_t *)0x0;
    free(xform);
  }
  return (transformData *)p;
}

Assistant:

transformData* deleteTransformation(transformData* xform,
            abrAtomListProc delAtomProc, void *deletestuff) {
   transformData* following = NULL;
   xformAtomRecords *p = NULL, *next = NULL;
   biasFunction *f = NULL, *nextf = NULL;

   if (xform) {
      for (p = xform->recs; p; p = next) {
         next = p->next;
         deleteXformAtomRecord(p, delAtomProc, deletestuff);
      }
      xform->recs = xform->lastrec = NULL;

      if (xform->name != NULL) {
         free(xform->name);
         xform->name = NULL;
      }

      for (f = xform->funcs; f; f = nextf) {
	 nextf = f->next;
	 f->next = NULL;
	 free(f);
      }
      xform->funcs = NULL;

      following = xform->next;
      xform->next = NULL;
      free(xform);
   }
   return following;
}